

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O2

void test_cio_write_buffer_split_and_append(void)

{
  int iVar1;
  cio_write_buffer *pcVar2;
  char *pcVar3;
  ulong expected;
  uint uVar4;
  ulong uVar5;
  int local_e4;
  cio_write_buffer wbh_to_append;
  cio_write_buffer wbh_to_split;
  char buf [100];
  
  local_e4 = 1;
  expected = 0;
  do {
    if (expected == 6) {
      return;
    }
    wbh_to_split.prev = &wbh_to_split;
    wbh_to_split.next = &wbh_to_split;
    wbh_to_split.data.head.q_len = 0;
    wbh_to_split.data.element.length = 0;
    for (uVar4 = 0; uVar4 != 6; uVar4 = uVar4 + 1) {
      pcVar2 = (cio_write_buffer *)malloc(0x20);
      if (pcVar2 == (cio_write_buffer *)0x0) {
        UnityFail("allocation of writebuffer element failed!",0x11d);
      }
      pcVar3 = (char *)malloc(100);
      if (pcVar3 == (char *)0x0) {
        UnityFail("allocation of writebuffer data element failed!",0x11f);
      }
      iVar1 = snprintf(pcVar3,99,"SL_BUFFER%u",(ulong)uVar4);
      if (99 < iVar1) {
        UnityFail("Write buffer for split list not filled correctly!",0x122);
      }
      (pcVar2->data).head.q_len = (size_t)pcVar3;
      (pcVar2->data).element.length = 100;
      cio_write_buffer_queue_tail(&wbh_to_split,pcVar2);
    }
    wbh_to_append.next = &wbh_to_append;
    wbh_to_append.data.head.q_len = 0;
    wbh_to_append.data.element.length = 0;
    wbh_to_append.prev = wbh_to_append.next;
    for (uVar4 = 0; pcVar2 = &wbh_to_split, iVar1 = local_e4, uVar4 != 2; uVar4 = uVar4 + 1) {
      pcVar2 = (cio_write_buffer *)malloc(0x20);
      if (pcVar2 == (cio_write_buffer *)0x0) {
        UnityFail("allocation of writebuffer element failed!",0x12d);
      }
      pcVar3 = (char *)malloc(100);
      if (pcVar3 == (char *)0x0) {
        UnityFail("allocation of writebuffer data element failed!",0x12f);
      }
      iVar1 = snprintf(pcVar3,99,"AL_BUFFER%u",(ulong)uVar4);
      if (99 < iVar1) {
        UnityFail("Write buffer for append list not filled correctly!",0x132);
      }
      (pcVar2->data).head.q_len = (size_t)pcVar3;
      (pcVar2->data).element.length = 100;
      cio_write_buffer_queue_tail(&wbh_to_append,pcVar2);
    }
    while (iVar1 != 0) {
      pcVar2 = pcVar2->next;
      iVar1 = iVar1 + -1;
    }
    cio_write_buffer_split_and_append(&wbh_to_append,&wbh_to_split,pcVar2);
    UnityAssertEqualNumber
              (expected,wbh_to_split.data.head.q_len,
               "Number of elements in splitted list not correct!",0x13f,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (expected * 100,wbh_to_split.data.element.length,
               "Total size of splitted list not correct!",0x140,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (8 - expected,wbh_to_append.data.head.q_len,
               "Number of elements in appended list not correct!",0x141,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((8 - expected) * 100,wbh_to_append.data.element.length,
               "Total size of appended list not correct!",0x142,UNITY_DISPLAY_STYLE_INT);
    pcVar2 = wbh_to_append.next;
    for (uVar4 = 0; uVar4 != 2; uVar4 = uVar4 + 1) {
      iVar1 = snprintf(buf,100,"AL_BUFFER%u",(ulong)uVar4);
      if (99 < iVar1) {
        UnityFail("Check buffer for append list not filled correctly!",0x149);
      }
      UnityAssertEqualString
                (buf,(char *)(pcVar2->data).element.field_0.const_data,
                 "Data in merged append buffer not correct!",0x14b);
      pcVar2 = pcVar2->next;
    }
    for (uVar5 = expected & 0xffffffff; (int)uVar5 != 6; uVar5 = (ulong)((int)uVar5 + 1)) {
      iVar1 = snprintf(buf,100,"SL_BUFFER%u",uVar5);
      if (99 < iVar1) {
        UnityFail("Check buffer for split list not filled correctly!",0x152);
      }
      UnityAssertEqualString
                (buf,(char *)(pcVar2->data).element.field_0.const_data,
                 "Data in merged split buffer not correct!",0x154);
      pcVar2 = pcVar2->next;
    }
    while (pcVar2 = cio_write_buffer_queue_dequeue(&wbh_to_split), pcVar2 != (cio_write_buffer *)0x0
          ) {
      free((pcVar2->data).element.field_0.const_data);
      free(pcVar2);
    }
    while (pcVar2 = cio_write_buffer_queue_dequeue(&wbh_to_append),
          pcVar2 != (cio_write_buffer *)0x0) {
      free((pcVar2->data).element.field_0.const_data);
      free(pcVar2);
    }
    expected = expected + 1;
    local_e4 = local_e4 + 1;
  } while( true );
}

Assistant:

static void test_cio_write_buffer_split_and_append(void)
{
	enum { SPLIT_LIST_LENGTH = 6 };
	for (unsigned int split_position = 0; split_position < SPLIT_LIST_LENGTH; split_position++) {
		struct cio_write_buffer wbh_to_split;
		cio_write_buffer_head_init(&wbh_to_split);

		enum { DATA_BUFFER_LENGTH = 100 };
		for (unsigned int i = 0; i < SPLIT_LIST_LENGTH; i++) {
			struct cio_write_buffer *wbe = malloc(sizeof(*wbe));
			TEST_ASSERT_NOT_NULL_MESSAGE(wbe, "allocation of writebuffer element failed!");
			char *data = malloc(DATA_BUFFER_LENGTH);
			TEST_ASSERT_NOT_NULL_MESSAGE(data, "allocation of writebuffer data element failed!");
			int ret = snprintf(data, DATA_BUFFER_LENGTH - 1, "SL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Write buffer for split list not filled correctly!");
			}
			cio_write_buffer_element_init(wbe, data, DATA_BUFFER_LENGTH);
			cio_write_buffer_queue_tail(&wbh_to_split, wbe);
		}

		struct cio_write_buffer wbh_to_append;
		cio_write_buffer_head_init(&wbh_to_append);
		enum { APPEND_LIST_LENGTH = 2 };
		for (unsigned int i = 0; i < APPEND_LIST_LENGTH; i++) {
			struct cio_write_buffer *wbe = malloc(sizeof(*wbe));
			TEST_ASSERT_NOT_NULL_MESSAGE(wbe, "allocation of writebuffer element failed!");
			char *data = malloc(DATA_BUFFER_LENGTH);
			TEST_ASSERT_NOT_NULL_MESSAGE(data, "allocation of writebuffer data element failed!");
			int ret = snprintf(data, DATA_BUFFER_LENGTH - 1, "AL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Write buffer for append list not filled correctly!");
			}
			cio_write_buffer_element_init(wbe, data, DATA_BUFFER_LENGTH);
			cio_write_buffer_queue_tail(&wbh_to_append, wbe);
		}

		struct cio_write_buffer *e = &wbh_to_split;

		for (unsigned int i = 0; i <= split_position; i++) {
			e = e->next;
		}

		cio_write_buffer_split_and_append(&wbh_to_append, &wbh_to_split, e);
		TEST_ASSERT_EQUAL_MESSAGE(split_position, cio_write_buffer_get_num_buffer_elements(&wbh_to_split), "Number of elements in splitted list not correct!");
		TEST_ASSERT_EQUAL_MESSAGE(split_position * DATA_BUFFER_LENGTH, cio_write_buffer_get_total_size(&wbh_to_split), "Total size of splitted list not correct!");
		TEST_ASSERT_EQUAL_MESSAGE(APPEND_LIST_LENGTH + (SPLIT_LIST_LENGTH - split_position), cio_write_buffer_get_num_buffer_elements(&wbh_to_append), "Number of elements in appended list not correct!");
		TEST_ASSERT_EQUAL_MESSAGE((APPEND_LIST_LENGTH + (SPLIT_LIST_LENGTH - split_position)) * DATA_BUFFER_LENGTH, cio_write_buffer_get_total_size(&wbh_to_append), "Total size of appended list not correct!");

		e = wbh_to_append.next;
		for (unsigned i = 0; i < APPEND_LIST_LENGTH; i++) {
			char buf[DATA_BUFFER_LENGTH];
			int ret = snprintf(buf, sizeof(buf), "AL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Check buffer for append list not filled correctly!");
			}
			TEST_ASSERT_EQUAL_STRING_MESSAGE(buf, e->data.element.data, "Data in merged append buffer not correct!");
			e = e->next;
		}
		for (unsigned i = split_position; i < SPLIT_LIST_LENGTH; i++) {
			char buf[DATA_BUFFER_LENGTH];
			int ret = snprintf(buf, sizeof(buf), "SL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Check buffer for split list not filled correctly!");
			}
			TEST_ASSERT_EQUAL_STRING_MESSAGE(buf, e->data.element.data, "Data in merged split buffer not correct!");
			e = e->next;
		}

		struct cio_write_buffer *remaining_buffer_in_split_list = cio_write_buffer_queue_dequeue(&wbh_to_split);
		while (remaining_buffer_in_split_list != NULL) {
			free(remaining_buffer_in_split_list->data.element.data);
			free(remaining_buffer_in_split_list);
			remaining_buffer_in_split_list = cio_write_buffer_queue_dequeue(&wbh_to_split);
		}

		struct cio_write_buffer *remaining_buffer_in_append_list = cio_write_buffer_queue_dequeue(&wbh_to_append);
		while (remaining_buffer_in_append_list != NULL) {
			free(remaining_buffer_in_append_list->data.element.data);
			free(remaining_buffer_in_append_list);
			remaining_buffer_in_append_list = cio_write_buffer_queue_dequeue(&wbh_to_append);
		}
	}
}